

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btMultiBodyDynamicsWorld::serialize(btMultiBodyDynamicsWorld *this,btSerializer *serializer)

{
  long *in_RSI;
  long *in_RDI;
  btSerializer *in_stack_00000038;
  btDiscreteDynamicsWorld *in_stack_00000040;
  btSerializer *in_stack_000000e8;
  btCollisionWorld *in_stack_000000f0;
  
  (**(code **)(*in_RSI + 0x40))();
  btDiscreteDynamicsWorld::serializeDynamicsWorldInfo
            (&this->super_btDiscreteDynamicsWorld,serializer);
  (**(code **)(*in_RDI + 0x170))(in_RDI,in_RSI);
  btDiscreteDynamicsWorld::serializeRigidBodies(in_stack_00000040,in_stack_00000038);
  btCollisionWorld::serializeCollisionObjects(in_stack_000000f0,in_stack_000000e8);
  (**(code **)(*in_RSI + 0x48))();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::serialize(btSerializer* serializer)
{

	serializer->startSerialization();

	serializeDynamicsWorldInfo( serializer);

	serializeMultiBodies(serializer);

	serializeRigidBodies(serializer);

	serializeCollisionObjects(serializer);

	serializer->finishSerialization();
}